

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsAccessImmutable(void)

{
  initializer_list<int> __l;
  reference piVar1;
  ostream *poVar2;
  Span<const_int,_18446744073709551615UL> SVar3;
  range_error *anon_var_0;
  undefined1 auStack_70 [3];
  bool caughtCorrectException;
  Span<const_int,_18446744073709551615UL> span;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_49);
  std::allocator<int>::~allocator(&local_49);
  SVar3 = MILBlob::Util::MakeSpan<int,_std::vector,_std::allocator<int>_>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  span.m_ptr = (pointer)SVar3.m_size.m_size;
  _auStack_70 = SVar3.m_ptr;
  piVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::operator[]
                     ((Span<const_int,_18446744073709551615UL> *)auStack_70,0);
  if (*piVar1 == 1) {
    piVar1 = MILBlob::Util::Span<const_int,_18446744073709551615UL>::At
                       ((Span<const_int,_18446744073709551615UL> *)auStack_70,1);
    if (*piVar1 == 2) {
      MILBlob::Util::Span<const_int,_18446744073709551615UL>::At
                ((Span<const_int,_18446744073709551615UL> *)auStack_70,5);
      poVar2 = std::operator<<((ostream *)&std::clog,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf3);
      std::operator<<(poVar2,": expected exception, but none thrown.\n");
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf2);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(span.At(1)) == (2)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf1);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"(span[0]) == (1)");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int testSpanTestsAccessImmutable()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    ML_ASSERT_EQ(span[0], 1);
    ML_ASSERT_EQ(span.At(1), 2);
    ML_ASSERT_THROWS(span.At(5), std::range_error);

    static_assert(std::is_same<decltype(span[0]), const int&>::value, "span[0] should not be mutable");
    static_assert(std::is_same<decltype(span.At(0)), const int&>::value, "span.At(0) should not be mutable");

    return 0;
}